

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetSensStats(void *cvode_mem,long *nfSevals,long *nfevalsS,long *nSetfails,
                     long *nlinsetupsS)

{
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  CVodeMem in_RDI;
  long *in_R8;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x8d3,"CVodeGetSensStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_sensi == 0) {
    cvProcessError(in_RDI,-0x28,0x8db,"CVodeGetSensStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x28;
  }
  else {
    *in_RSI = in_RDI->cv_nfSe;
    *in_RDX = in_RDI->cv_nfeS;
    *in_RCX = in_RDI->cv_netfS;
    *in_R8 = in_RDI->cv_nsetupsS;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetSensStats(void* cvode_mem, long int* nfSevals, long int* nfevalsS,
                      long int* nSetfails, long int* nlinsetupsS)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  *nfSevals    = cv_mem->cv_nfSe;
  *nfevalsS    = cv_mem->cv_nfeS;
  *nSetfails   = cv_mem->cv_netfS;
  *nlinsetupsS = cv_mem->cv_nsetupsS;

  return (CV_SUCCESS);
}